

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record-replay.cpp
# Opt level: O2

bool __thiscall
replay_entry_t::load
          (replay_entry_t *this,char *type,char *pedigee_str,int32_t value1,int32_t value2)

{
  short sVar1;
  int iVar2;
  uint64_t uVar3;
  uint64_t *puVar4;
  short sVar5;
  long lVar6;
  uint64_t *puVar7;
  char *end;
  uint64_t temp_pedigree [256];
  
  iVar2 = strcmp(type,"Steal");
  if (iVar2 == 0) {
    this->m_type = ped_type_steal;
    this->m_value = (int16_t)value1;
  }
  else {
    this->m_value = -1;
    iVar2 = strcmp(type,"Sync");
    if (iVar2 == 0) {
      this->m_type = ped_type_sync;
    }
    else {
      iVar2 = strcmp(type,"Orphaned");
      if (iVar2 != 0) {
        this->m_type = ped_type_unknown;
        return false;
      }
      this->m_type = ped_type_orphaned;
    }
  }
  this->m_pedigree_len = 0;
  do {
    uVar3 = strtol(pedigee_str,&end,10);
    sVar1 = this->m_pedigree_len;
    sVar5 = sVar1 + 1;
    this->m_pedigree_len = sVar5;
    temp_pedigree[sVar1] = uVar3;
    pedigee_str = end + 1;
  } while (*end != '\0');
  puVar4 = (uint64_t *)__cilkrts_malloc((long)sVar5 << 3);
  this->m_reverse_pedigree = puVar4;
  sVar1 = this->m_pedigree_len;
  lVar6 = 0;
  iVar2 = 0;
  if (0 < sVar1) {
    iVar2 = (int)sVar1;
  }
  puVar7 = temp_pedigree + (long)sVar1 + -1;
  for (; iVar2 != lVar6; lVar6 = lVar6 + 1) {
    puVar4[lVar6] = *puVar7;
    puVar7 = puVar7 + -1;
  }
  return true;
}

Assistant:

bool load(const char *type, const char *pedigee_str, int32_t value1, int32_t value2)
    {
        // Convert the type into an enum
        if (0 == strcmp(type, PED_TYPE_STR_STEAL))
        {
            m_type = ped_type_steal;
            m_value = (int16_t)value1;   // Victim
        }
        else
        {
            m_value = -1;      // Victim not valid
            if (0 == strcmp(type, PED_TYPE_STR_SYNC))
                m_type = ped_type_sync;
            else if (0 == strcmp(type, PED_TYPE_STR_ORPHANED))
                m_type = ped_type_orphaned;
            else
            {
                m_type = ped_type_unknown;
                return false;
            }
        }

        // Parse the pedigree
        m_pedigree_len = 0;

        const char *p = pedigee_str;
        char *end;

        uint64_t temp_pedigree[PEDIGREE_BUFF_SIZE/2];

        while(1)
        {
            temp_pedigree[m_pedigree_len++] = (uint64_t)strtol(p, &end, 10);
            if ('\0' == *end)
                break;
            p = end + 1;
        }

        // Allocate memory to hold the pedigree.
        // Copy the pedigree in reverse order since that's the order we'll
        // traverse it
        m_reverse_pedigree =
            (uint64_t *)__cilkrts_malloc(sizeof(int64_t) * m_pedigree_len);
        for (int n = 0; n < m_pedigree_len; n++)
            m_reverse_pedigree[n] = temp_pedigree[(m_pedigree_len - 1) - n];

        return true;
    }